

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O2

void __thiscall chrono::turtlebot::Turtlebot_Part::AddVisualizationAssets(Turtlebot_Part *this)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_178;
  double local_168;
  double dStack_160;
  double local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string vis_mesh_file;
  ChFrame<double> local_110;
  ChVector<double> local_88;
  ChMatrix33<double> local_68;
  
  std::operator+(&local_150,"robot/turtlebot/",&this->m_mesh_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                 &local_150,".obj");
  chrono::GetChronoDataFile((string *)&vis_mesh_file);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&trimesh,SUB81(&vis_mesh_file,0),true);
  local_168 = (this->m_offset).m_data[0];
  dStack_160 = (this->m_offset).m_data[1];
  local_158 = (this->m_offset).m_data[2];
  ChMatrix33<double>::ChMatrix33(&local_68,1.0);
  (**(code **)(*(long *)trimesh.
                        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x80))
            (trimesh.
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&local_168,&local_68);
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar2 = trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_178,
               &trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
  chrono::ChTriangleMeshShape::SetMesh(peVar2,&local_178,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  std::__cxx11::string::_M_assign
            ((string *)
             (trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             0x40));
  trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [9] = (element_type)0x0;
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChTriangleMeshShape,void>
            (local_188,
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
  local_150._M_dataplus._M_p = &DAT_3ff0000000000000;
  local_88.m_data[2] = 0.0;
  local_150.field_2._8_8_ = 0;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  ChFrame<double>::ChFrame(&local_110,&local_88,(ChQuaternion<double> *)&local_150);
  chrono::ChPhysicsItem::AddVisualShape(peVar1,local_188,&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trimesh.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&vis_mesh_file);
  return;
}

Assistant:

void Turtlebot_Part::AddVisualizationAssets() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
    trimesh->Transform(m_offset, ChMatrix33<>(1));
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetName(m_mesh_name);
    trimesh_shape->SetMutable(false);
    m_body->AddVisualShape(trimesh_shape);
    return;
}